

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O0

void examine_object(obj *obj)

{
  short sVar1;
  int nn;
  objclass *ocl;
  int typ;
  obj *obj_local;
  
  sVar1 = obj->otyp;
  if ((((objects[(int)sVar1].field_0x10 & 1) == 0) &&
      (((byte)objects[(int)sVar1].field_0x10 >> 2 & 1) != 0)) &&
     (((byte)objects[(int)sVar1].field_0x10 >> 6 & 1) != 0)) {
    *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xffffffef;
  }
  if ((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
      (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
     ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
    *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xffffffdf | 0x20;
  }
  if (urole.malenum == 0x161) {
    *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xffffffbf | 0x40;
  }
  if ((obj->oprops & 0xfffffU) != 0) {
    obj->oprops_known = obj->oprops_known | 0x80000000;
  }
  return;
}

Assistant:

void examine_object(struct obj *obj)
{
	int typ = obj->otyp;
	struct objclass *ocl = &objects[typ];
	int nn = ocl->oc_name_known;
	
	/* clean up known when it's tied to oc_name_known, eg after AD_DRIN */
	if (!nn && ocl->oc_uses_known && ocl->oc_unique) obj->known = 0;
	if (!Blind) obj->dknown = TRUE;
	if (Role_if (PM_PRIEST)) obj->bknown = TRUE;

	/* everybody can sense these for now, otherwise these will be
	 * ignored like +5 armor hidden amongst tons of +0 junk */
	if (obj->oprops & ITEM_PROP_MASK)
	    obj->oprops_known |= ITEM_MAGICAL;
}